

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

void rest_rooms(memfile *mf,level *lev)

{
  int iVar1;
  short sVar2;
  
  mfmagic_check(mf,0x54424452);
  iVar1 = mread32(mf);
  lev->nroom = iVar1;
  lev->nsubroom = 0;
  for (sVar2 = 0; sVar2 < iVar1; sVar2 = sVar2 + 1) {
    rest_room(mf,lev,lev->rooms + sVar2);
    lev->rooms[sVar2].resident = (monst *)0x0;
    iVar1 = lev->nroom;
  }
  lev->rooms[iVar1].hx = -1;
  lev->subrooms[lev->nsubroom].hx = -1;
  return;
}

Assistant:

void rest_rooms(struct memfile *mf, struct level *lev)
{
	short i;

	mfmagic_check(mf, ROOMS_MAGIC); /* "RDAT" */
	lev->nroom = mread32(mf);
	lev->nsubroom = 0;
	for (i = 0; i<lev->nroom; i++) {
	    rest_room(mf, lev, &lev->rooms[i]);
	    lev->rooms[i].resident = NULL;
	}
	lev->rooms[lev->nroom].hx = -1;		/* restore ending flags */
	lev->subrooms[lev->nsubroom].hx = -1;
}